

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::(anonymous_namespace)::SocketAddress> *
kj::heapArray<kj::(anonymous_namespace)::SocketAddress>
          (Array<kj::(anonymous_namespace)::SocketAddress> *__return_storage_ptr__,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content)

{
  size_t size;
  undefined1 local_40 [8];
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> builder;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content_local;
  
  builder.disposer = (ArrayDisposer *)content.ptr;
  size = ArrayPtr<kj::(anonymous_namespace)::SocketAddress>::size
                   ((ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *)&builder.disposer);
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_40,size);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::
  addAll<kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>&>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_40,
             (ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *)&builder.disposer);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::finish
            (__return_storage_ptr__,
             (ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_40);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(ArrayPtr<T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}